

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

Opnd * __thiscall
BackwardPass::FindNoImplicitCallUse<BackwardPass::UpdateArrayValueTypes(IR::Instr*,IR::Opnd*)::__0>
          (BackwardPass *this,Instr *instr,Opnd *opnd,anon_class_8_1_e7f4faeb IsCheckedUse,
          Instr **noImplicitCallUsesInstrRef)

{
  Opnd *pOVar1;
  code *pcVar2;
  bool bVar3;
  ObjectType OVar4;
  ObjectType OVar5;
  undefined4 *puVar6;
  Opnd *checkedSrc;
  Opnd *this_00;
  bool bVar7;
  Instr *this_01;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  if (this == (BackwardPass *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1206,"(instr)","instr");
    if (!bVar3) goto LAB_003e611f;
    *puVar6 = 0;
  }
  if (*(short *)&this->currentRegion == 0x246) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1207,"(instr->m_opcode != Js::OpCode::NoImplicitCallUses)",
                       "instr->m_opcode != Js::OpCode::NoImplicitCallUses");
    if (!bVar3) {
LAB_003e611f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  this_01 = *(Instr **)&this->tag;
  if (this_01 != (Instr *)0x0) {
    while ((this_01->m_kind != InstrKindLabel && (this_01->m_kind != InstrKindProfiledLabel))) {
      bVar3 = IR::Instr::IsRealInstr(this_01);
      if (bVar3) {
        if ((this_01->m_kind == InstrKindByteCodeUses) && (this_01->m_opcode == ByteCodeUses))
        goto LAB_003e6066;
        break;
      }
      if (this_01->m_opcode == NoImplicitCallUses) break;
LAB_003e6066:
      this_01 = this_01->m_prev;
      if (this_01 == (Instr *)0x0) {
        return (Opnd *)0x0;
      }
    }
    do {
      if (this_01->m_opcode != NoImplicitCallUses) {
        return (Opnd *)0x0;
      }
      pOVar1 = this_01->m_src2;
      this_00 = this_01->m_src1;
      bVar3 = true;
      do {
        bVar7 = bVar3;
        if (this_00 == (Opnd *)0x0) break;
        bVar3 = IR::Opnd::IsEqual(this_00,(Opnd *)instr);
        if (bVar3) {
          local_32 = (this_00->m_valueType).field_0;
          bVar3 = ValueType::IsLikelyObject((ValueType *)&local_32.field_0);
          if (bVar3) {
            OVar4 = ValueType::GetObjectType((ValueType *)&local_32.field_0);
            OVar5 = ValueType::GetObjectType((ValueType *)opnd);
            if (OVar4 == OVar5) {
              return this_00;
            }
          }
        }
        this_00 = pOVar1;
        bVar3 = false;
      } while (bVar7);
      this_01 = this_01->m_prev;
    } while (this_01 != (Instr *)0x0);
  }
  return (Opnd *)0x0;
}

Assistant:

IR::Opnd *
BackwardPass::FindNoImplicitCallUse(
    IR::Instr *const instr,
    IR::Opnd *const opnd,
    const F IsCheckedUse,
    IR::Instr * *const noImplicitCallUsesInstrRef)
{
    Assert(instr);
    Assert(instr->m_opcode != Js::OpCode::NoImplicitCallUses);

    // Skip byte-code uses
    IR::Instr *prevInstr = instr->m_prev;
    while(
        prevInstr &&
        !prevInstr->IsLabelInstr() &&
        (!prevInstr->IsRealInstr() || prevInstr->IsByteCodeUsesInstr()) &&
        prevInstr->m_opcode != Js::OpCode::NoImplicitCallUses)
    {
        prevInstr = prevInstr->m_prev;
    }

    // Find the corresponding use in a NoImplicitCallUses instruction
    for(; prevInstr && prevInstr->m_opcode == Js::OpCode::NoImplicitCallUses; prevInstr = prevInstr->m_prev)
    {
        IR::Opnd *const checkedSrcs[] = { prevInstr->GetSrc1(), prevInstr->GetSrc2() };
        for(int i = 0; i < sizeof(checkedSrcs) / sizeof(checkedSrcs[0]) && checkedSrcs[i]; ++i)
        {
            IR::Opnd *const checkedSrc = checkedSrcs[i];
            if(checkedSrc->IsEqual(opnd) && IsCheckedUse(checkedSrc))
            {
                if(noImplicitCallUsesInstrRef)
                {
                    *noImplicitCallUsesInstrRef = prevInstr;
                }
                return checkedSrc;
            }
        }
    }

    if(noImplicitCallUsesInstrRef)
    {
        *noImplicitCallUsesInstrRef = nullptr;
    }
    return nullptr;
}